

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

void __thiscall
OpenMD::SelectionSet::flip(SelectionSet *this,vector<int,_std::allocator<int>_> *bitIndex)

{
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RDI;
  OpenMDBitSet *unaff_retaddr;
  int i;
  undefined4 local_14;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *bitIndex_00;
  
  bitIndex_00 = in_RDI;
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (in_RDI,(long)local_14);
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_14);
    OpenMDBitSet::flip(unaff_retaddr,(size_t)bitIndex_00);
  }
  return;
}

Assistant:

void SelectionSet::flip(std::vector<int> bitIndex) {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i].flip(bitIndex[i]);
  }